

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.cpp
# Opt level: O2

char * NULLCString::strcpy(char *__dest,char *__src)

{
  int iVar1;
  int in_ECX;
  long in_RDX;
  char *pcVar2;
  
  if (__dest == (char *)0x0) {
    pcVar2 = "destination string is null";
  }
  else if (in_RDX == 0) {
    pcVar2 = "source string is null";
  }
  else {
    pcVar2 = (char *)0x0;
    while (iVar1 = (int)pcVar2, in_ECX != iVar1) {
      if ((int)__src == iVar1) {
        pcVar2 = "buffer overflow";
        goto LAB_0012688c;
      }
      if (pcVar2[in_RDX] == '\0') {
        __dest[(long)pcVar2] = '\0';
        return pcVar2;
      }
      __dest[(long)pcVar2] = pcVar2[in_RDX];
      pcVar2 = (char *)(ulong)(iVar1 + 1);
    }
    pcVar2 = "string is not null-terminated";
  }
LAB_0012688c:
  nullcThrowError(pcVar2);
  return (char *)0xffffffffffffffff;
}

Assistant:

int strcpy(NULLCArray dst, NULLCArray src)
	{
		if(!dst.ptr)
		{
			nullcThrowError("destination string is null");
			return -1;
		}

		if(!src.ptr)
		{
			nullcThrowError("source string is null");
			return -1;
		}

		for(unsigned i = 0; i < src.len; i++)
		{
			if(i >= dst.len)
			{
				nullcThrowError("buffer overflow");
				return -1;
			}

			if(!src.ptr[i])
			{
				dst.ptr[i] = 0;

				return i;
			}
			else
			{
				dst.ptr[i] = src.ptr[i];
			}
		}

		nullcThrowError("string is not null-terminated");
		return -1;
	}